

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void WriteVarInt<AutoFile,(VarIntMode)0,unsigned_int>(AutoFile *os,uint n)

{
  long lVar1;
  byte bVar2;
  uint in_ESI;
  long in_FS_OFFSET;
  bool bVar3;
  int len;
  uchar tmp [5];
  CheckVarIntMode<(VarIntMode)0,_unsigned_int> *in_stack_ffffffffffffffd8;
  int local_20;
  uint local_1c;
  AutoFile *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckVarIntMode<(VarIntMode)0,_unsigned_int>::CheckVarIntMode(in_stack_ffffffffffffffd8);
  local_20 = 0;
  local_1c = in_ESI;
  while( true ) {
    bVar2 = 0;
    if (local_20 != 0) {
      bVar2 = 0x80;
    }
    (&stack0xfffffffffffffff3)[local_20] = (byte)local_1c & 0x7f | bVar2;
    if (local_1c < 0x80) break;
    local_1c = (local_1c >> 7) - 1;
    local_20 = local_20 + 1;
  }
  do {
    ser_writedata8<AutoFile>(in_stack_fffffffffffffff0,n._3_1_);
    bVar3 = local_20 != 0;
    local_20 = local_20 + -1;
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}